

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.h
# Opt level: O0

bool __thiscall cmSearchPath::PathWithPrefix::operator<(PathWithPrefix *this,PathWithPrefix *other)

{
  bool bVar1;
  __type _Var2;
  bool local_29;
  bool local_19;
  PathWithPrefix *other_local;
  PathWithPrefix *this_local;
  
  bVar1 = std::operator<(&this->Path,&other->Path);
  local_19 = true;
  if (!bVar1) {
    _Var2 = std::operator==(&this->Path,&other->Path);
    local_29 = false;
    if (_Var2) {
      local_29 = std::operator<(&this->Prefix,&other->Prefix);
    }
    local_19 = local_29;
  }
  return local_19;
}

Assistant:

bool operator<(const PathWithPrefix& other) const
    {
      return this->Path < other.Path ||
        (this->Path == other.Path && this->Prefix < other.Prefix);
    }